

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::~QProcess(QProcess *this)

{
  QProcessPrivate *this_00;
  QProcess *this_01;
  QString *t;
  int __sig;
  __pid_t __pid;
  EVP_PKEY_CTX *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QProcessPrivate *d;
  QString *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  int iVar1;
  char *in_stack_ffffffffffffff78;
  QMessageLogger *in_stack_ffffffffffffff80;
  QMessageLogger *this_02;
  QDebug *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc8;
  QDebug local_10;
  long local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&in_RDI->context = &PTR_metaObject_00bebc78;
  this_02 = in_RDI;
  this_00 = d_func((QProcess *)0x79083e);
  if (this_00->processState != '\0') {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,iVar1,
               (char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning(in_RDI);
    this_01 = (QProcess *)QDebug::nospace(&local_10);
    t = (QString *)QDebug::operator<<((QDebug *)this_02,in_stack_ffffffffffffffc8);
    program((QProcess *)t);
    QDir::toNativeSeparators(in_stack_ffffffffffffff68);
    QDebug::operator<<((QDebug *)this_01,t);
    iVar1 = (int)((ulong)t >> 0x20);
    __pid = 0xa0dbbf;
    QDebug::operator<<((QDebug *)this_02,in_stack_ffffffffffffffc8);
    QString::~QString((QString *)0x790900);
    QString::~QString((QString *)0x79090a);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    kill((QProcess *)in_RDI,__pid,__sig);
    in_RSI = (EVP_PKEY_CTX *)0x7530;
    waitForFinished(this_01,iVar1);
  }
  QProcessPrivate::cleanup(this_00,in_RSI);
  QIODevice::~QIODevice((QIODevice *)0x79094c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QProcess::~QProcess()
{
    Q_D(QProcess);
    if (d->processState != NotRunning) {
        qWarning().nospace()
            << "QProcess: Destroyed while process (" << QDir::toNativeSeparators(program()) << ") is still running.";
        kill();
        waitForFinished();
    }
    d->cleanup();
}